

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O1

SQString * __thiscall SQVM::PrintObjVal(SQVM *this,SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQChar *pSVar2;
  SQString *pSVar3;
  SQSharedState *this_00;
  
  SVar1 = (o->super_SQObject)._type;
  if (SVar1 == OT_INTEGER) {
    pSVar2 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
    snprintf(pSVar2,0x32,"%lld",(o->super_SQObject)._unVal.pTable);
  }
  else {
    if (SVar1 != OT_FLOAT) {
      if (SVar1 == OT_STRING) {
        return (SQString *)(o->super_SQObject)._unVal.pTable;
      }
      this_00 = this->_sharedstate;
      pSVar2 = GetTypeName(o);
      goto LAB_0011c834;
    }
    pSVar2 = SQSharedState::GetScratchPad(this->_sharedstate,0x33);
    snprintf(pSVar2,0x32,"%.14g",(double)(o->super_SQObject)._unVal.fFloat);
  }
  this_00 = this->_sharedstate;
  pSVar2 = SQSharedState::GetScratchPad(this_00,-1);
LAB_0011c834:
  pSVar3 = SQString::Create(this_00,pSVar2,-1);
  return pSVar3;
}

Assistant:

SQString *SQVM::PrintObjVal(const SQObjectPtr &o)
{
    switch(sq_type(o)) {
    case OT_STRING: return _string(o);
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR), _PRINT_INT_FMT, _integer(o));
        return SQString::Create(_ss(this), _spval);
        break;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)), sq_rsl(NUMBER_MAX_CHAR), _SC("%.14g"), _float(o));
        return SQString::Create(_ss(this), _spval);
        break;
    default:
        return SQString::Create(_ss(this), GetTypeName(o));
    }
}